

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S2Test.cpp
# Opt level: O3

void __thiscall testForceOnSo3::test_method(testForceOnSo3 *this)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *__ptr;
  double *__ptr_00;
  Index i;
  long lVar4;
  S2 S;
  Point rot;
  double *local_268;
  long local_260;
  shared_count sStack_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  S2 local_1e8 [136];
  double *local_160;
  undefined8 local_158;
  void *local_140;
  ConstSubPoint local_130 [272];
  
  mnf::S2::S2(local_1e8);
  __ptr = Eigen::internal::conditional_aligned_new_auto<double,true>(3);
  __ptr_00 = Eigen::internal::conditional_aligned_new_auto<double,true>(3);
  mnf::Manifold::createRandomPoint(1.0);
  lVar4 = 0;
  do {
    iVar3 = rand();
    __ptr_00[lVar4] = (((double)iVar3 + (double)iVar3) / 2147483647.0 + -1.0) * 0.01;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  mnf::SubPoint::value();
  if (local_260 == 3) {
    dVar1 = __ptr_00[1];
    dVar2 = local_268[1];
    *__ptr = *local_268 + *__ptr_00;
    __ptr[1] = dVar2 + dVar1;
    __ptr[2] = local_268[2] + __ptr_00[2];
    local_158 = 3;
    local_160 = __ptr;
    mnf::Manifold::forceOnM(local_1e8);
    free((void *)0x0);
    local_1f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
    ;
    local_1f0 = "";
    local_208 = &boost::unit_test::basic_cstring<char_const>::null;
    local_200 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f8,0x5c);
    mnf::Manifold::isInM((Matrix *)local_1e8,1e-08);
    sStack_230.pi_ = (sp_counted_base *)0x0;
    local_218 = "S.isInM(perturbedRotVec)";
    local_210 = "";
    local_228 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
    ;
    local_220 = "";
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_230);
    mnf::ConstSubPoint::~ConstSubPoint(local_130);
    free(local_140);
    free(__ptr_00);
    free(__ptr);
    mnf::Manifold::~Manifold((Manifold *)local_1e8);
    return;
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Ref<Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

BOOST_AUTO_TEST_CASE(testForceOnSo3)
{
  S2 S;
  Eigen::VectorXd perturbedRotVec(3);
  Eigen::VectorXd randM(3);
  Point rot = S.createRandomPoint();
  randM = 0.01 * Eigen::VectorXd::Random(3);
  perturbedRotVec = rot.value() + randM;
  S.forceOnM(perturbedRotVec, perturbedRotVec);
  BOOST_CHECK(S.isInM(perturbedRotVec));
}